

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log.h
# Opt level: O2

void __thiscall
xlib::Log::SWrite<int>
          (Log *this,LOG_PRIORITY pri,char *file,uint32_t line,char *function,bool br,string *format
          ,int *args)

{
  string temp;
  string local_50;
  
  std::__cxx11::string::string((string *)&local_50,(string *)format);
  Format<int>(this,&local_50,args);
  Write(this,pri,file,line,function,br,local_50._M_dataplus._M_p);
  std::__cxx11::string::~string((string *)&local_50);
  return;
}

Assistant:

void SWrite(LOG_PRIORITY pri, const char* file, uint32_t line, const char* function,
        bool br, const std::string& format, const Args&... args) {
        std::string temp(format);
        Format(&temp, args...);
        Write(pri, file, line, function, br, temp.c_str());
    }